

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Constant * __thiscall soul::heart::Allocator::allocateZeroInitialiser(Allocator *this,Type *type)

{
  Constant *pCVar1;
  Type local_70;
  Value local_58;
  Type *local_18;
  Type *type_local;
  Allocator *this_local;
  
  local_18 = type;
  type_local = (Type *)this;
  Type::Type(&local_70,type);
  soul::Value::zeroInitialiser(&local_58,&local_70);
  pCVar1 = allocateConstant(this,&local_58);
  soul::Value::~Value(&local_58);
  Type::~Type(&local_70);
  return pCVar1;
}

Assistant:

Constant& allocateZeroInitialiser (const Type& type)  { return allocateConstant (Value::zeroInitialiser (type)); }